

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  int iVar1;
  float *pfVar2;
  unsigned_short *puVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImFontGlyph *pIVar10;
  ulong uVar11;
  ImFontGlyph *pIVar12;
  long lVar13;
  float *pfVar14;
  uint uVar15;
  uint uVar16;
  int n;
  ushort uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar11 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar11 == 0) {
    uVar16 = 1;
  }
  else {
    lVar13 = 0;
    uVar16 = 0;
    do {
      uVar15 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar13) >> 2;
      if (uVar15 < uVar16) {
        uVar15 = uVar16;
      }
      uVar16 = uVar15;
      lVar13 = lVar13 + 0x28;
    } while (uVar11 * 0x28 != lVar13);
    uVar16 = uVar16 + 1;
  }
  pfVar2 = (this->IndexAdvanceX).Data;
  if (pfVar2 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar2);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar3 = (this->IndexLookup).Data;
  if (puVar3 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar3);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar16);
  iVar19 = (this->Glyphs).Size;
  lVar13 = (long)iVar19;
  if (0 < lVar13) {
    pfVar2 = (this->IndexAdvanceX).Data;
    puVar3 = (this->IndexLookup).Data;
    pfVar14 = &((this->Glyphs).Data)->AdvanceX;
    lVar18 = 0;
    do {
      uVar15 = *(uint *)(pfVar14 + -1);
      *(float *)((long)pfVar2 + (ulong)(uVar15 & 0xfffffffc)) = *pfVar14;
      puVar3[uVar15 >> 2] = (unsigned_short)lVar18;
      this->Used4kPagesMap[uVar15 >> 0x11] =
           this->Used4kPagesMap[uVar15 >> 0x11] | (byte)(1 << ((byte)(uVar15 >> 0xe) & 7));
      lVar18 = lVar18 + 1;
      pfVar14 = pfVar14 + 10;
    } while (lVar13 != lVar18);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    if (((undefined1  [40])(this->Glyphs).Data[lVar13 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar20 = iVar19 + 1;
      iVar1 = (this->Glyphs).Capacity;
      if (iVar1 <= iVar19) {
        if (iVar1 == 0) {
          iVar19 = 8;
        }
        else {
          iVar19 = iVar1 / 2 + iVar1;
        }
        if (iVar19 <= iVar20) {
          iVar19 = iVar20;
        }
        if (iVar1 < iVar19) {
          pIVar10 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar19 * 0x28);
          pIVar12 = (this->Glyphs).Data;
          if (pIVar12 != (ImFontGlyph *)0x0) {
            memcpy(pIVar10,pIVar12,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar10;
          (this->Glyphs).Capacity = iVar19;
        }
      }
      (this->Glyphs).Size = iVar20;
    }
    pIVar12 = (this->Glyphs).Data;
    iVar19 = (this->Glyphs).Size;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pIVar10 = this->FallbackGlyph;
    }
    else {
      pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
    fVar21 = pIVar10->V1;
    pIVar12[(long)iVar19 + -1].U1 = pIVar10->U1;
    pIVar12[(long)iVar19 + -1].V1 = fVar21;
    uVar6 = *(undefined4 *)&pIVar10->field_0x0;
    fVar7 = pIVar10->AdvanceX;
    fVar8 = pIVar10->X0;
    fVar9 = pIVar10->Y0;
    fVar21 = pIVar10->Y1;
    fVar4 = pIVar10->U0;
    fVar5 = pIVar10->V0;
    pIVar12[(long)iVar19 + -1].X1 = pIVar10->X1;
    pIVar12[(long)iVar19 + -1].Y1 = fVar21;
    pIVar12[(long)iVar19 + -1].U0 = fVar4;
    pIVar12[(long)iVar19 + -1].V0 = fVar5;
    *(undefined4 *)&pIVar12[(long)iVar19 + -1].field_0x0 = uVar6;
    pIVar12[(long)iVar19 + -1].AdvanceX = fVar7;
    pIVar12[(long)iVar19 + -1].X0 = fVar8;
    pIVar12[(long)iVar19 + -1].Y0 = fVar9;
    *(uint *)(pIVar12 + (long)iVar19 + -1) = *(uint *)(pIVar12 + (long)iVar19 + -1) & 3 | 0x24;
    fVar21 = pIVar12[(long)iVar19 + -1].AdvanceX * 4.0;
    pIVar12[(long)iVar19 + -1].AdvanceX = fVar21;
    (this->IndexAdvanceX).Data[9] = fVar21;
    (this->IndexLookup).Data[*(uint *)(pIVar12 + (long)iVar19 + -1) >> 2] =
         (short)(this->Glyphs).Size - 1;
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  if (((uint)(this->IndexLookup).Size < 10) ||
     (uVar17 = (this->IndexLookup).Data[9], uVar17 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
  }
  local_30[2] = 0x2026;
  local_30[3] = 0x85;
  local_30[0] = 0x2e;
  local_30[1] = 0xff0e;
  if (this->EllipsisChar == 0xffff) {
    lVar13 = 0;
    do {
      uVar17 = local_30[lVar13 + 2];
      if ((((ulong)uVar17 < (ulong)(long)(this->IndexLookup).Size) &&
          ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_001336a3;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 2);
    uVar17 = 0xffff;
LAB_001336a3:
    this->EllipsisChar = uVar17;
  }
  if (this->DotChar == 0xffff) {
    lVar13 = 0;
    do {
      uVar17 = local_30[lVar13];
      if ((((ulong)uVar17 < (ulong)(long)(this->IndexLookup).Size) &&
          ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_001336e4;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 2);
    uVar17 = 0xffff;
LAB_001336e4:
    this->DotChar = uVar17;
  }
  uVar11 = (ulong)(this->IndexLookup).Size;
  if (this->FallbackChar < uVar11) {
    uVar17 = (this->IndexLookup).Data[this->FallbackChar];
    pIVar12 = (ImFontGlyph *)0x0;
    if (uVar17 != 0xffff) {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
  }
  else {
    pIVar12 = (ImFontGlyph *)0x0;
  }
  this->FallbackGlyph = pIVar12;
  if (pIVar12 == (ImFontGlyph *)0x0) {
    lVar13 = 0;
    do {
      uVar17 = *(ushort *)((long)&DAT_00166842 + lVar13);
      if (((uVar17 < uVar11) && ((this->IndexLookup).Data[uVar17] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_00133761;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 6);
    uVar17 = 0xffff;
LAB_00133761:
    this->FallbackChar = uVar17;
    if (uVar17 < uVar11) {
      uVar17 = (this->IndexLookup).Data[uVar17];
      pIVar12 = (ImFontGlyph *)0x0;
      if (uVar17 != 0xffff) {
        pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
      }
    }
    else {
      pIVar12 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar12;
    if (pIVar12 == (ImFontGlyph *)0x0) {
      pIVar12 = (this->Glyphs).Data + (long)(this->Glyphs).Size + -1;
      this->FallbackGlyph = pIVar12;
      this->FallbackChar = (ImWchar)(*(uint *)pIVar12 >> 2);
    }
  }
  pfVar2 = (this->IndexAdvanceX).Data;
  this->FallbackAdvanceX = this->FallbackGlyph->AdvanceX;
  uVar11 = 0;
  do {
    pfVar14 = pfVar2 + uVar11;
    if (*pfVar14 <= 0.0 && *pfVar14 != 0.0) {
      pfVar2[uVar11] = this->FallbackAdvanceX;
    }
    uVar11 = uVar11 + 1;
  } while (uVar16 != uVar11);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}